

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10a9f7::CompressorState::deviceUpdate(CompressorState *this,ALCdevice *device)

{
  uint uVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  float releaseCount;
  float attackCount;
  
  uVar1 = *(uint *)(in_RSI + 0xc);
  dVar2 = std::pow(5.34643470770547e-315,
                   (double)(ulong)(uint)(1.0 / ((float)*(uint *)(in_RSI + 0xc) * 0.1)));
  *(int *)(in_RDI + 0x424) = SUB84(dVar2,0);
  dVar2 = std::pow(5.18065378653631e-315,(double)(ulong)(uint)(1.0 / ((float)uVar1 * 0.2)));
  *(int *)(in_RDI + 0x428) = SUB84(dVar2,0);
  return;
}

Assistant:

void CompressorState::deviceUpdate(const ALCdevice *device)
{
    /* Number of samples to do a full attack and release (non-integer sample
     * counts are okay).
     */
    const float attackCount{static_cast<float>(device->Frequency) * ATTACK_TIME};
    const float releaseCount{static_cast<float>(device->Frequency) * RELEASE_TIME};

    /* Calculate per-sample multipliers to attack and release at the desired
     * rates.
     */
    mAttackMult  = std::pow(AMP_ENVELOPE_MAX/AMP_ENVELOPE_MIN, 1.0f/attackCount);
    mReleaseMult = std::pow(AMP_ENVELOPE_MIN/AMP_ENVELOPE_MAX, 1.0f/releaseCount);
}